

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

void anon_unknown.dwarf_267407::set_cb
               (Caliper *c,ChannelBody *param_2,Attribute *attr,Variant *value)

{
  ostream *poVar1;
  string local_240;
  Log local_220;
  
  std::mutex::lock((mutex *)(anonymous_namespace)::dbg_mutex);
  std::ofstream::ofstream(&local_220);
  local_220.m_level = 1;
  poVar1 = cali::Log::stream(&local_220);
  poVar1 = std::operator<<(poVar1,"Event: pre_set (");
  cali::Attribute::name_abi_cxx11_(&local_240,attr);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"=");
  poVar1 = cali::operator<<(poVar1,value);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_240);
  std::ofstream::~ofstream(&local_220);
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::dbg_mutex);
  return;
}

Assistant:

void set_cb(Caliper* c, ChannelBody*, const Attribute& attr, const Variant& value)
{
    std::lock_guard<std::mutex> lock(dbg_mutex);
    Log(1).stream() << "Event: pre_set (" << attr.name() << "=" << value << ")\n";
}